

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O2

void to_z80(i386 *i,vector<z80,_std::allocator<z80>_> *instructions)

{
  OpCode op;
  pointer pzVar1;
  pointer pzVar2;
  pointer pzVar3;
  bool bVar4;
  long lVar5;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  pointer pzVar6;
  string text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 *local_e0;
  undefined8 local_d8;
  undefined1 local_d0 [8];
  undefined8 uStack_c8;
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  undefined8 uStack_a8;
  string_type local_a0;
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  switch((i->super_ASMLine).type) {
  case Label:
  case Comment:
    std::vector<z80,std::allocator<z80>>::
    emplace_back<ASMLine::Type_const&,std::__cxx11::string_const&>
              ((vector<z80,std::allocator<z80>> *)instructions,(Type *)i,&(i->super_ASMLine).text);
    break;
  case Instruction:
    pzVar6 = (instructions->super__Vector_base<z80,_std::allocator<z80>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pzVar1 = (instructions->super__Vector_base<z80,_std::allocator<z80>_>)._M_impl.
             super__Vector_impl_data._M_start;
    op = i->opcode;
    Operand::Operand((Operand *)local_58,&i->operand1);
    Operand::Operand((Operand *)local_80,&i->operand2);
    translate_instruction(instructions,op,(Operand *)local_58,(Operand *)local_80);
    std::__cxx11::string::~string((string *)(local_80 + 8));
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::string((string *)&text,(string *)&i->line_text);
    if (*text._M_dataplus._M_p == '\t') {
      std::__cxx11::string::erase((ulong)&text,0);
    }
    pzVar2 = (instructions->super__Vector_base<z80,_std::allocator<z80>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pzVar3 = (instructions->super__Vector_base<z80,_std::allocator<z80>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    std::__cxx11::string::string((string *)&local_e0,(string *)&text);
    for (pzVar6 = (pointer)((long)pzVar6 + ((long)pzVar2 - (long)pzVar1)); pzVar6 != pzVar3;
        pzVar6 = pzVar6 + 1) {
      std::__cxx11::string::_M_assign((string *)&pzVar6->comment);
    }
    local_c0 = local_b0;
    if (local_e0 == local_d0) {
      uStack_a8 = uStack_c8;
    }
    else {
      local_c0 = local_e0;
    }
    local_b8 = local_d8;
    local_d8 = 0;
    local_d0[0] = 0;
    local_e0 = local_d0;
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&text);
    break;
  case Directive:
    text.field_2._M_allocated_capacity = 0;
    text.field_2._8_8_ = 0;
    text._M_dataplus._M_p = (pointer)0x0;
    text._M_string_length = 0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_100,"\\.asciz\\s(.*)",
               0x10);
    bVar4 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&(i->super_ASMLine).text,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&text,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_100,0
                      );
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_100);
    if (bVar4) {
      lVar5 = text._M_string_length - (long)text._M_dataplus._M_p;
      if ((lVar5 == 0) || (0xfffffffffffffffd < lVar5 / 0x18 - 5U)) {
        this = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(text._M_dataplus._M_p + lVar5 + -0x48);
      }
      else {
        this = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(text._M_dataplus._M_p + 0x18);
      }
      std::__cxx11::
      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::str(&local_a0,this);
      std::operator+(&local_100,".asciiz ",&local_a0);
      std::vector<z80,std::allocator<z80>>::emplace_back<ASMLine::Type_const&,std::__cxx11::string>
                ((vector<z80,std::allocator<z80>> *)instructions,(Type *)i,&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    std::
    _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&text);
  }
  return;
}

Assistant:

void to_z80(const i386& i, std::vector<z80>& instructions) {
	try {
		switch (i.type) {
			case ASMLine::Type::Label:
			case ASMLine::Type::Comment:
				instructions.emplace_back(i.type, i.text);
				return;
			case ASMLine::Type::Directive:
				{
					std::smatch match;
					if (std::regex_match(i.text, match, std::regex(R"(\.asciz\s(.*))"))) {
						instructions.emplace_back(i.type, ".asciiz " + std::string(match[1]));
					}
				}
				return;
			case ASMLine::Type::Instruction:
				const auto head = instructions.size();
				translate_instruction(instructions, i.opcode, i.operand1, i.operand2);

				auto text = i.line_text;
				if (text[0] == '\t') {
					text.erase(0, 1);
				}
				for_each(std::next(instructions.begin(), head), instructions.end(),
						[text](auto& ins) {
							ins.comment = text;
						}
				);
				return;
		}
	}
	catch (const std::exception& e) {
		log(LogLevel::Error, i, e.what());
	}
}